

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

int valid_nifti_extensions(nifti_image *nim)

{
  int iVar1;
  uint uVar2;
  char *__format;
  char **ppcVar3;
  uint uVar4;
  
  if ((nim->num_ext < 1) || (nim->ext_list == (nifti1_extension *)0x0)) {
    iVar1 = 0;
    if (2 < g_opts_0) {
      valid_nifti_extensions_cold_1();
    }
  }
  else {
    if (nim->num_ext < 1) {
      uVar2 = 0;
    }
    else {
      ppcVar3 = &nim->ext_list->edata;
      uVar2 = 0;
      uVar4 = 0;
      do {
        if ((0x28 < (uint)*(int *)((long)ppcVar3 + -4) || (*(int *)((long)ppcVar3 + -4) & 1U) != 0)
           && (1 < g_opts_0)) {
          fprintf(_stderr,"-d ext %d, unknown code %d\n",(ulong)uVar4);
        }
        if (((nifti1_extension *)(ppcVar3 + -1))->esize < 1) {
          if (1 < g_opts_0) {
            __format = "-d ext %d, bad size = %d\n";
LAB_0011236c:
            fprintf(_stderr,__format,(ulong)uVar4);
          }
LAB_00112328:
          uVar2 = uVar2 + 1;
        }
        else if ((((nifti1_extension *)(ppcVar3 + -1))->esize & 0xfU) != 0) {
          if (1 < g_opts_0) {
            __format = "-d ext %d, size %d not multiple of 16\n";
            goto LAB_0011236c;
          }
          goto LAB_00112328;
        }
        if (*ppcVar3 == (char *)0x0) {
          if (1 < g_opts_0) {
            fprintf(_stderr,"-d ext %d, missing data\n",(ulong)uVar4);
          }
          uVar2 = uVar2 + 1;
        }
        uVar4 = uVar4 + 1;
        ppcVar3 = ppcVar3 + 2;
      } while ((int)uVar4 < nim->num_ext);
    }
    if ((int)uVar2 < 1) {
      iVar1 = 1;
    }
    else {
      iVar1 = 0;
      if (0 < g_opts_0) {
        iVar1 = 0;
        fprintf(_stderr,"-d had %d extension errors, none will be written\n",(ulong)uVar2);
      }
    }
  }
  return iVar1;
}

Assistant:

int valid_nifti_extensions(const nifti_image * nim)
{
   nifti1_extension * ext;
   int                c, errs;

   if( nim->num_ext <= 0 || nim->ext_list == NULL ){
      if( g_opts.debug > 2 ) fprintf(stderr,"-d empty extension list\n");
      return 0;
   }

   /* for each extension, check code, size and data pointer */
   ext = nim->ext_list;
   errs = 0;
   for ( c = 0; c < nim->num_ext; c++ ){
      if( ! nifti_is_valid_ecode(ext->ecode) ) {
         if( g_opts.debug > 1 )
            fprintf(stderr,"-d ext %d, unknown code %d\n", c, ext->ecode);
         /* should not be fatal    29 Apr 2015 [rickr] */
      }

      if( ext->esize <= 0 ){
         if( g_opts.debug > 1 )
            fprintf(stderr,"-d ext %d, bad size = %d\n", c, ext->esize);
         errs++;
      } else if( ext->esize & 0xf ){
         if( g_opts.debug > 1 )
            fprintf(stderr,"-d ext %d, size %d not multiple of 16\n",
                    c, ext->esize);
         errs++;
      }

      if( ext->edata == NULL ){
         if( g_opts.debug > 1 ) fprintf(stderr,"-d ext %d, missing data\n", c);
         errs++;
      }

      ext++;
   }

   if( errs > 0 ){
      if( g_opts.debug > 0 )
         fprintf(stderr,"-d had %d extension errors, none will be written\n",
                 errs);
      return 0;
   }

   /* if we're here, we're good */
   return 1;
}